

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

int __thiscall options::value<int>(options *this,char *s)

{
  mapped_type *pmVar1;
  allocator<char> local_1c1;
  int v;
  unique_lock<std::mutex> lock;
  istringstream ss;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->m);
  std::__cxx11::string::string<std::allocator<char>>((string *)&v,s,&local_1c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->opts,(key_type *)&v);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)pmVar1,_S_in);
  std::__cxx11::string::~string((string *)&v);
  std::istream::operator>>((istream *)&ss,&v);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return v;
}

Assistant:

inline T value(const char* s) {
		std::unique_lock<std::mutex> lock(m);
		std::istringstream ss{ opts[std::string{s}] };
		T v;
		ss >> v;
		return v;
	}